

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Maze.cpp
# Opt level: O2

void __thiscall Maze::Maze(Maze *this,string *inputFileName)

{
  ifstream *this_00;
  char cVar1;
  istream *piVar2;
  value_type *__x;
  ostream *poVar3;
  int i;
  ulong uVar4;
  vector<bool,_std::allocator<bool>_> usedRow;
  vector<char,_std::allocator<char>_> Row;
  string tempRow;
  
  std::
  stack<std::tuple<int,int>,std::deque<std::tuple<int,int>,std::allocator<std::tuple<int,int>>>>::
  stack<std::deque<std::tuple<int,int>,std::allocator<std::tuple<int,int>>>,void>(&this->pathStack);
  this_00 = &this->MazeStream;
  (this->used).
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->startCell).super__Tuple_impl<0UL,_int,_int> = (_Tuple_impl<0UL,_int,_int>)0x0;
  (this->used).
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->used).
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->solvedMatrix).
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->solvedMatrix).
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->MazeMatrix).
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->solvedMatrix).
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MazeMatrix).
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MazeMatrix).
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->endCell).super__Tuple_impl<0UL,_int,_int> = (_Tuple_impl<0UL,_int,_int>)0x0;
  std::ifstream::ifstream(this_00);
  std::ifstream::open((string *)this_00,(_Ios_Openmode)inputFileName);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cout,"Could not open file");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    tempRow._M_dataplus._M_p = (pointer)&tempRow.field_2;
    tempRow._M_string_length = 0;
    tempRow.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)this_00,(string *)&tempRow);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      Row.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      usedRow.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      usedRow.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      usedRow.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      Row.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      Row.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      usedRow.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_offset = 0;
      usedRow.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      for (uVar4 = 0; uVar4 < tempRow._M_string_length; uVar4 = uVar4 + 1) {
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)
                   &usedRow.super__Bvector_base<std::allocator<bool>_>,false);
        __x = (value_type *)std::__cxx11::string::at((ulong)&tempRow);
        std::vector<char,_std::allocator<char>_>::push_back
                  ((vector<char,_std::allocator<char>_> *)
                   &Row.super__Vector_base<char,_std::allocator<char>_>,__x);
      }
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::push_back(&this->MazeMatrix,
                  (value_type *)&Row.super__Vector_base<char,_std::allocator<char>_>);
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::push_back(&this->solvedMatrix,
                  (value_type *)&Row.super__Vector_base<char,_std::allocator<char>_>);
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::push_back(&this->used,(value_type *)&usedRow.super__Bvector_base<std::allocator<bool>_>);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&usedRow.super__Bvector_base<std::allocator<bool>_>);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&Row.super__Vector_base<char,_std::allocator<char>_>);
    }
    this->isSolved = false;
    std::ifstream::close();
    std::__cxx11::string::~string((string *)&tempRow);
  }
  return;
}

Assistant:

Maze::Maze(std::string inputFileName) {
    //constructs the maze, and the solved mazed.
    MazeStream.open(inputFileName);
    if (!MazeStream.is_open())  {
        std::cout<< "Could not open file" << std::endl;
        return;
    }
    std::string tempRow;
    while (getline(MazeStream, tempRow)){
        std::vector<char> Row;
        std::vector<bool> usedRow;
        for(int i = 0; i<tempRow.size(); i++)
        {
            usedRow.push_back(false);
            Row.push_back(tempRow.at(i));
        }
        MazeMatrix.push_back(Row);
        //the solution
        solvedMatrix.push_back(Row);
        used.push_back(usedRow);
    }
    isSolved = false;
    MazeStream.close();
}